

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O1

void __thiscall cab::update_position(cab *this,node_type position)

{
  pointer *pprVar1;
  pointer prVar2;
  node_type nVar3;
  uint32_t uVar4;
  pointer prVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  cab_manager::update_cab(this->_cab_manager,this->_id,this->_position,position);
  this->_position = position;
  prVar5 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_finish != prVar5) {
    lVar8 = -0x10;
    lVar6 = 0;
    uVar7 = 0;
    do {
      nVar3 = request::src((request *)(&prVar5->_src + lVar6));
      if (nVar3 == position) {
        uVar4 = request::passengers((request *)
                                    (&((this->_requests).
                                       super__Vector_base<request,_std::allocator<request>_>._M_impl
                                       .super__Vector_impl_data._M_start)->_src + lVar6));
        this->_passengers = this->_passengers + uVar4;
        request::pick_up((request *)
                         (&((this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                            _M_impl.super__Vector_impl_data._M_start)->_src + lVar6));
      }
      nVar3 = request::dst((request *)
                           (&((this->_requests).
                              super__Vector_base<request,_std::allocator<request>_>._M_impl.
                              super__Vector_impl_data._M_start)->_src + lVar6));
      if (nVar3 == position) {
        uVar4 = request::passengers((request *)
                                    (&((this->_requests).
                                       super__Vector_base<request,_std::allocator<request>_>._M_impl
                                       .super__Vector_impl_data._M_start)->_src + lVar6));
        this->_passengers = this->_passengers - uVar4;
        prVar5 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                 super__Vector_impl_data._M_start;
        prVar2 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pointer)(&prVar5[1]._src + lVar6) != prVar2) {
          memmove(&prVar5->_src + lVar6,(pointer)(&prVar5[1]._src + lVar6),
                  (size_t)((long)prVar2 + (lVar8 - (long)prVar5)));
        }
        pprVar1 = &(this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + -1;
      }
      uVar7 = uVar7 + 1;
      prVar5 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
      lVar8 = lVar8 + -0x10;
    } while (uVar7 < (ulong)((long)(this->_requests).
                                   super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)prVar5 >> 4));
  }
  return;
}

Assistant:

void cab::update_position(node_type position)
{
    _cab_manager->update_cab(_id, _position, position);
    _position = position;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == position)
        {
            _passengers += _requests[i].passengers();
            _requests[i].pick_up();
        }

        if(_requests[i].dst() == position)
        {
            _passengers -= _requests[i].passengers();
            _requests.erase(_requests.begin() + i);
        }
    }
}